

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cordz_functions.cc
# Opt level: O0

int64_t absl::lts_20250127::cord_internal::cordz_should_profile_slow(SamplingState *state)

{
  long lVar1;
  bool bVar2;
  int32_t iVar3;
  int64_t iVar4;
  long *in_FS_OFFSET;
  SamplingState *local_78;
  bool should_sample;
  int64_t stride;
  int64_t old_stride;
  bool initialized;
  int32_t mean_interval;
  SamplingState *state_local;
  
  iVar3 = get_cordz_mean_interval();
  if (iVar3 < 1) {
    state->next_sample = 0x10000;
    state->sample_stride = 0x10000;
    state_local = (SamplingState *)0x0;
  }
  else if (iVar3 == 1) {
    state->next_sample = 1;
    state->sample_stride = 1;
    state_local = (SamplingState *)0x1;
  }
  else if (*(long *)(*in_FS_OFFSET + -0x58) < 1) {
    lVar1 = *(long *)(*in_FS_OFFSET + -0x58);
    local_78 = (SamplingState *)state->sample_stride;
    iVar4 = profiling_internal::ExponentialBiased::GetStride
                      ((ExponentialBiased *)(*in_FS_OFFSET + -0x28),(long)iVar3);
    state->next_sample = iVar4;
    state->sample_stride = iVar4;
    bVar2 = true;
    if (lVar1 == -1) {
      iVar4 = cordz_should_profile();
      bVar2 = 0 < iVar4;
    }
    if (!bVar2) {
      local_78 = (SamplingState *)0x0;
    }
    state_local = local_78;
  }
  else {
    state->next_sample = state->next_sample + -1;
    state_local = (SamplingState *)0x0;
  }
  return (int64_t)state_local;
}

Assistant:

ABSL_ATTRIBUTE_NOINLINE int64_t
cordz_should_profile_slow(SamplingState& state) {

  thread_local absl::profiling_internal::ExponentialBiased
      exponential_biased_generator;
  int32_t mean_interval = get_cordz_mean_interval();

  // Check if we disabled profiling. If so, set the next sample to a "large"
  // number to minimize the overhead of the should_profile codepath.
  if (mean_interval <= 0) {
    state = {kIntervalIfDisabled, kIntervalIfDisabled};
    return 0;
  }

  // Check if we're always sampling.
  if (mean_interval == 1) {
    state = {1, 1};
    return 1;
  }

  if (cordz_next_sample.next_sample <= 0) {
    // If first check on current thread, check cordz_should_profile()
    // again using the created (initial) stride in cordz_next_sample.
    const bool initialized =
        cordz_next_sample.next_sample != kInitCordzNextSample;
    auto old_stride = state.sample_stride;
    auto stride = exponential_biased_generator.GetStride(mean_interval);
    state = {stride, stride};
    bool should_sample = initialized || cordz_should_profile() > 0;
    return should_sample ? old_stride : 0;
  }

  --state.next_sample;
  return 0;
}